

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_ls.c
# Opt level: O3

int arkLs_AccessMassMem(ARKodeMem ark_mem,char *fname,ARKLsMassMem *arkls_mem)

{
  ARKLsMassMem pAVar1;
  int iVar2;
  
  pAVar1 = (ARKLsMassMem)(*ark_mem->step_getmassmem)(ark_mem);
  if (pAVar1 == (ARKLsMassMem)0x0) {
    iVar2 = -6;
    arkProcessError(ark_mem,-6,0xfe9,fname,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode_ls.c"
                    ,"Mass matrix solver memory is NULL.");
  }
  else {
    *arkls_mem = pAVar1;
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int arkLs_AccessMassMem(ARKodeMem ark_mem, const char* fname,
                        ARKLsMassMem* arkls_mem)
{
  void* ark_step_massmem;
  ark_step_massmem = ark_mem->step_getmassmem(ark_mem);
  if (ark_step_massmem == NULL)
  {
    arkProcessError(ark_mem, ARKLS_MASSMEM_NULL, __LINE__, fname, __FILE__,
                    MSG_LS_MASSMEM_NULL);
    return (ARKLS_MASSMEM_NULL);
  }
  *arkls_mem = (ARKLsMassMem)ark_step_massmem;
  return (ARKLS_SUCCESS);
}